

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O2

void __thiscall gui::Panel::draw(Panel *this)

{
  RenderTarget *in_RSI;
  undefined1 in_stack_00000008 [104];
  
  draw((Panel *)&this[-1].style_,in_RSI,(RenderStates)in_stack_00000008);
  return;
}

Assistant:

void Panel::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->rect_.setSize(size_);
    target.draw(style_->rect_, states);

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}